

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Vec<Hpipe::Lexer::TrainingData> * __thiscall
Hpipe::Lexer::training_data(Vec<Hpipe::Lexer::TrainingData> *__return_storage_ptr__,Lexer *this)

{
  Lexem *pLVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  istream *piVar6;
  int iVar7;
  int local_298;
  allocator local_291;
  Lexer *local_290;
  Lexem *local_288;
  vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>> *local_280;
  string freq;
  string line;
  TrainingData td;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  size_t idx;
  istringstream is;
  
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar1 = &this->first_item;
  local_290 = this;
  local_280 = (vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>> *)
              __return_storage_ptr__;
  do {
    do {
      pLVar1 = pLVar1->next;
      if (pLVar1 == (Lexem *)0x0) {
        return (Vec<Hpipe::Lexer::TrainingData> *)local_280;
      }
    } while (pLVar1->type != TRAINING);
    td.name._M_dataplus._M_p = (pointer)&td.name.field_2;
    td.name._M_string_length = 0;
    td.name.field_2._M_local_buf[0] = '\0';
    td.inp._M_dataplus._M_p = (pointer)&td.inp.field_2;
    td.inp._M_string_length = 0;
    td.inp.field_2._M_local_buf[0] = '\0';
    freq._M_dataplus._M_p = (pointer)&freq.field_2;
    freq._M_string_length = 0;
    freq.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::substr((ulong)&line,(ulong)&pLVar1->str);
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&line,_S_in);
    std::__cxx11::string::~string((string *)&line);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&td);
    while ((td.name._M_string_length != 0 && (*td.name._M_dataplus._M_p == ' '))) {
      std::__cxx11::string::substr((ulong)&line,(ulong)&td);
      std::__cxx11::string::operator=((string *)&td,(string *)&line);
      std::__cxx11::string::~string((string *)&line);
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    local_298 = 0;
    local_288 = pLVar1;
    iVar2 = 0;
    iVar3 = 0;
LAB_00173cc0:
    while (iVar5 = iVar3, iVar7 = iVar2,
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&is,(string *)&line),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      iVar2 = iVar7;
      iVar3 = iVar5;
      if (line._M_string_length < 4) {
LAB_00173dc6:
        bVar4 = anon_unknown_9::only_spaces(&line);
        if (bVar4) {
          if (iVar5 == 2) {
            if (local_298 != 0) {
              std::__cxx11::string::push_back((char)&freq);
            }
            std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
            std::__cxx11::string::append((string *)&freq);
            goto LAB_00173fc2;
          }
          if (iVar5 == 1) {
            iVar2 = 1;
            iVar3 = 1;
            if (iVar7 != 0) {
              std::__cxx11::string::push_back((char)&td + '(');
              iVar2 = iVar7 + 1;
              iVar3 = 1;
            }
          }
        }
        else {
          err(local_290,local_288,
              "String inside test must have spaces at the beginning: 4 spaces for command names, at least 8 for command data"
             );
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
        bVar4 = std::operator==(&local_1f0,"    ");
        std::__cxx11::string::~string((string *)&local_1f0);
        if (!bVar4) goto LAB_00173dc6;
        if (line._M_string_length < 8) {
LAB_00173e6a:
          if (6 < line._M_string_length) goto LAB_00173e74;
          goto LAB_00173ef4;
        }
        std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
        bVar4 = std::operator==(&local_1f0,"    ");
        std::__cxx11::string::~string((string *)&local_1f0);
        if (!bVar4) goto LAB_00173e6a;
        if (iVar5 == 0) {
          err(local_290,local_288,
              "String inside test must have spaces at the beginning: 1 space for command names, at least 2 for command data"
             );
          iVar3 = 0;
        }
        else {
          if (iVar5 != 1) {
            if (local_298 != 0) {
              std::__cxx11::string::push_back((char)&freq);
            }
            std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
            std::__cxx11::string::append((string *)&freq);
            goto LAB_00173fc2;
          }
          if (iVar7 != 0) {
            std::__cxx11::string::push_back((char)&td + '(');
          }
          std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
          std::__cxx11::string::append((string *)&td.inp);
          std::__cxx11::string::~string((string *)&local_1f0);
          iVar2 = iVar7 + 1;
          iVar3 = 1;
        }
      }
    }
LAB_0017402a:
    idx = 0;
    std::__cxx11::string::string((string *)&local_1f0,freq._M_dataplus._M_p,&local_291);
    td.freq = std::__cxx11::stod(&local_1f0,&idx);
    std::__cxx11::string::~string((string *)&local_1f0);
    pLVar1 = local_288;
    if (idx == 0) {
      if (freq._M_string_length != 0) {
        err(local_290,local_288,"Freq does not appear to be a correct number");
      }
      td.freq = 1.0;
    }
    std::vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>>::
    emplace_back<Hpipe::Lexer::TrainingData_const&>(local_280,&td);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
    std::__cxx11::string::~string((string *)&freq);
    TrainingData::~TrainingData(&td);
  } while( true );
LAB_00173e74:
  std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
  bVar4 = std::operator==(&local_1f0,"inp");
  std::__cxx11::string::~string((string *)&local_1f0);
  iVar3 = 1;
  if (!bVar4) {
    if (7 < line._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
      bVar4 = std::operator==(&local_1f0,"freq");
      std::__cxx11::string::~string((string *)&local_1f0);
      iVar3 = 2;
      if (bVar4) goto LAB_00173cc0;
    }
LAB_00173ef4:
    bVar4 = anon_unknown_9::only_spaces(&line);
    if (!bVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     "Unknown test command \'",&line);
      std::operator+(&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,"\'")
      ;
      err(local_290,local_288,local_1f0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&idx);
      goto LAB_0017402a;
    }
    if (iVar5 == 2) {
      if (local_298 != 0) {
        std::__cxx11::string::push_back((char)&freq);
      }
      std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&line);
      std::__cxx11::string::append((string *)&freq);
LAB_00173fc2:
      local_298 = local_298 + 1;
      std::__cxx11::string::~string((string *)&local_1f0);
      iVar3 = 2;
    }
    else {
      iVar3 = iVar5;
      if (iVar5 == 1) {
        iVar2 = 1;
        iVar3 = 1;
        if (iVar7 != 0) {
          std::__cxx11::string::push_back((char)&td + '(');
          iVar2 = iVar7 + 1;
          iVar3 = 1;
        }
      }
    }
  }
  goto LAB_00173cc0;
}

Assistant:

const Lexem *Lexer::find_machine( const std::string &name) const {
    const Lexem *margs;
    return find_machine( margs, name );
}